

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall
t_rs_generator::render_list_sync_read(t_rs_generator *this,t_list *tlist,string *list_var)

{
  ostream *poVar1;
  string local_160;
  string local_140;
  string local_120;
  allocator local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  string list_elem_var;
  string local_98;
  string local_78;
  string local_48;
  t_type *local_28;
  t_type *elem_type;
  string *list_var_local;
  t_list *tlist_local;
  t_rs_generator *this_local;
  
  elem_type = (t_type *)list_var;
  list_var_local = (string *)tlist;
  tlist_local = (t_list *)this;
  local_28 = t_list::get_elem_type(tlist);
  t_generator::indent_abi_cxx11_(&local_48,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_48);
  poVar1 = std::operator<<(poVar1,"let list_ident = i_prot.read_list_begin()?;");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_48);
  t_generator::indent_abi_cxx11_(&local_78,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_78);
  poVar1 = std::operator<<(poVar1,"let mut ");
  poVar1 = std::operator<<(poVar1,(string *)elem_type);
  poVar1 = std::operator<<(poVar1,": ");
  to_rust_type_abi_cxx11_(&local_98,this,(t_type *)list_var_local);
  poVar1 = std::operator<<(poVar1,(string *)&local_98);
  poVar1 = std::operator<<(poVar1," = Vec::with_capacity(list_ident.size as usize);");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  t_generator::indent_abi_cxx11_
            ((string *)(list_elem_var.field_2._M_local_buf + 8),&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,
                           (string *)(list_elem_var.field_2._M_local_buf + 8));
  poVar1 = std::operator<<(poVar1,"for _ in 0..list_ident.size {");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(list_elem_var.field_2._M_local_buf + 8));
  t_generator::indent_up(&this->super_t_generator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"list_elem_",&local_f9);
  t_generator::tmp((string *)local_d8,&this->super_t_generator,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  render_type_sync_read(this,(string *)local_d8,local_28,false);
  t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_120);
  poVar1 = std::operator<<(poVar1,(string *)elem_type);
  poVar1 = std::operator<<(poVar1,".push(");
  poVar1 = std::operator<<(poVar1,(string *)local_d8);
  poVar1 = std::operator<<(poVar1,");");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_120);
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_140,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_140);
  poVar1 = std::operator<<(poVar1,"}");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_140);
  t_generator::indent_abi_cxx11_(&local_160,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_160);
  poVar1 = std::operator<<(poVar1,"i_prot.read_list_end()?;");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)local_d8);
  return;
}

Assistant:

void t_rs_generator::render_list_sync_read(t_list *tlist, const string &list_var) {
  t_type* elem_type = tlist->get_elem_type();

  f_gen_ << indent() << "let list_ident = i_prot.read_list_begin()?;" << endl;
  f_gen_
    << indent()
    << "let mut " << list_var << ": " << to_rust_type((t_type*) tlist)
    << " = Vec::with_capacity(list_ident.size as usize);"
    << endl;
  f_gen_ << indent() << "for _ in 0..list_ident.size {" << endl;

  indent_up();

  string list_elem_var = tmp("list_elem_");
  render_type_sync_read(list_elem_var, elem_type);
  f_gen_ << indent() << list_var << ".push(" << list_elem_var << ");" << endl;

  indent_down();

  f_gen_ << indent() << "}" << endl;
  f_gen_ << indent() << "i_prot.read_list_end()?;" << endl;
}